

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binding-hash.cc
# Opt level: O2

void __thiscall
wabt::BindingHash::CallCallbacks
          (BindingHash *this,ValueTypeVector *duplicates,DuplicateCallback *callback)

{
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>
  **pppVar1;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>
  **pppVar2;
  bool bVar3;
  long lVar4;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>
  **pppVar5;
  __normal_iterator<const_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>_*const_*,_std::vector<const_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>_*,_std::allocator<const_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>_*>_>_>
  __it;
  __normal_iterator<const_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>_*const_*,_std::vector<const_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>_*,_std::allocator<const_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>_*>_>_>
  _Var6;
  long lVar7;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>
  **local_38;
  
  pppVar5 = (duplicates->
            super__Vector_base<const_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>_*,_std::allocator<const_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>_*>_>
            )._M_impl.super__Vector_impl_data._M_start;
  pppVar1 = (duplicates->
            super__Vector_base<const_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>_*,_std::allocator<const_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>_*>_>
            )._M_impl.super__Vector_impl_data._M_finish;
  do {
    if (pppVar5 == pppVar1) {
      return;
    }
    __it._M_current =
         (duplicates->
         super__Vector_base<const_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>_*,_std::allocator<const_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>_*>_>
         )._M_impl.super__Vector_impl_data._M_start;
    pppVar2 = (duplicates->
              super__Vector_base<const_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>_*,_std::allocator<const_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>_*>_>
              )._M_impl.super__Vector_impl_data._M_finish;
    lVar7 = (long)pppVar2 - (long)__it._M_current;
    local_38 = pppVar5;
    for (lVar4 = lVar7 >> 5; 0 < lVar4; lVar4 = lVar4 + -1) {
      bVar3 = __gnu_cxx::__ops::
              _Iter_pred<wabt::BindingHash::CallCallbacks(std::vector<std::pair<std::__cxx11::string_const,wabt::Binding>const*,std::allocator<std::pair<std::__cxx11::string_const,wabt::Binding>const*>>const&,std::function<void(std::pair<std::__cxx11::string_const,wabt::Binding>const&,std::pair<std::__cxx11::string_const,wabt::Binding>const&)>)const::$_0>
              ::operator()((_Iter_pred<wabt::BindingHash::CallCallbacks(std::vector<std::pair<std::__cxx11::string_const,wabt::Binding>const*,std::allocator<std::pair<std::__cxx11::string_const,wabt::Binding>const*>>const&,std::function<void(std::pair<std::__cxx11::string_const,wabt::Binding>const&,std::pair<std::__cxx11::string_const,wabt::Binding>const&)>)const::__0>
                            *)&local_38,__it);
      _Var6._M_current = __it._M_current;
      if (bVar3) goto LAB_00183cda;
      bVar3 = __gnu_cxx::__ops::
              _Iter_pred<wabt::BindingHash::CallCallbacks(std::vector<std::pair<std::__cxx11::string_const,wabt::Binding>const*,std::allocator<std::pair<std::__cxx11::string_const,wabt::Binding>const*>>const&,std::function<void(std::pair<std::__cxx11::string_const,wabt::Binding>const&,std::pair<std::__cxx11::string_const,wabt::Binding>const&)>)const::$_0>
              ::operator()((_Iter_pred<wabt::BindingHash::CallCallbacks(std::vector<std::pair<std::__cxx11::string_const,wabt::Binding>const*,std::allocator<std::pair<std::__cxx11::string_const,wabt::Binding>const*>>const&,std::function<void(std::pair<std::__cxx11::string_const,wabt::Binding>const&,std::pair<std::__cxx11::string_const,wabt::Binding>const&)>)const::__0>
                            *)&local_38,
                           (__normal_iterator<const_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>_*const_*,_std::vector<const_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>_*,_std::allocator<const_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>_*>_>_>
                            )(__it._M_current + 1));
      _Var6._M_current = __it._M_current + 1;
      if (bVar3) goto LAB_00183cda;
      bVar3 = __gnu_cxx::__ops::
              _Iter_pred<wabt::BindingHash::CallCallbacks(std::vector<std::pair<std::__cxx11::string_const,wabt::Binding>const*,std::allocator<std::pair<std::__cxx11::string_const,wabt::Binding>const*>>const&,std::function<void(std::pair<std::__cxx11::string_const,wabt::Binding>const&,std::pair<std::__cxx11::string_const,wabt::Binding>const&)>)const::$_0>
              ::operator()((_Iter_pred<wabt::BindingHash::CallCallbacks(std::vector<std::pair<std::__cxx11::string_const,wabt::Binding>const*,std::allocator<std::pair<std::__cxx11::string_const,wabt::Binding>const*>>const&,std::function<void(std::pair<std::__cxx11::string_const,wabt::Binding>const&,std::pair<std::__cxx11::string_const,wabt::Binding>const&)>)const::__0>
                            *)&local_38,
                           (__normal_iterator<const_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>_*const_*,_std::vector<const_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>_*,_std::allocator<const_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>_*>_>_>
                            )(__it._M_current + 2));
      _Var6._M_current = __it._M_current + 2;
      if (bVar3) goto LAB_00183cda;
      bVar3 = __gnu_cxx::__ops::
              _Iter_pred<wabt::BindingHash::CallCallbacks(std::vector<std::pair<std::__cxx11::string_const,wabt::Binding>const*,std::allocator<std::pair<std::__cxx11::string_const,wabt::Binding>const*>>const&,std::function<void(std::pair<std::__cxx11::string_const,wabt::Binding>const&,std::pair<std::__cxx11::string_const,wabt::Binding>const&)>)const::$_0>
              ::operator()((_Iter_pred<wabt::BindingHash::CallCallbacks(std::vector<std::pair<std::__cxx11::string_const,wabt::Binding>const*,std::allocator<std::pair<std::__cxx11::string_const,wabt::Binding>const*>>const&,std::function<void(std::pair<std::__cxx11::string_const,wabt::Binding>const&,std::pair<std::__cxx11::string_const,wabt::Binding>const&)>)const::__0>
                            *)&local_38,
                           (__normal_iterator<const_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>_*const_*,_std::vector<const_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>_*,_std::allocator<const_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>_*>_>_>
                            )(__it._M_current + 3));
      _Var6._M_current = __it._M_current + 3;
      if (bVar3) goto LAB_00183cda;
      __it._M_current = __it._M_current + 4;
      lVar7 = lVar7 + -0x20;
    }
    lVar7 = lVar7 >> 3;
    if (lVar7 == 1) {
LAB_00183cc5:
      bVar3 = __gnu_cxx::__ops::
              _Iter_pred<wabt::BindingHash::CallCallbacks(std::vector<std::pair<std::__cxx11::string_const,wabt::Binding>const*,std::allocator<std::pair<std::__cxx11::string_const,wabt::Binding>const*>>const&,std::function<void(std::pair<std::__cxx11::string_const,wabt::Binding>const&,std::pair<std::__cxx11::string_const,wabt::Binding>const&)>)const::$_0>
              ::operator()((_Iter_pred<wabt::BindingHash::CallCallbacks(std::vector<std::pair<std::__cxx11::string_const,wabt::Binding>const*,std::allocator<std::pair<std::__cxx11::string_const,wabt::Binding>const*>>const&,std::function<void(std::pair<std::__cxx11::string_const,wabt::Binding>const&,std::pair<std::__cxx11::string_const,wabt::Binding>const&)>)const::__0>
                            *)&local_38,__it);
      _Var6._M_current = pppVar2;
      if (bVar3) {
        _Var6._M_current = __it._M_current;
      }
    }
    else if (lVar7 == 2) {
LAB_00183ca7:
      bVar3 = __gnu_cxx::__ops::
              _Iter_pred<wabt::BindingHash::CallCallbacks(std::vector<std::pair<std::__cxx11::string_const,wabt::Binding>const*,std::allocator<std::pair<std::__cxx11::string_const,wabt::Binding>const*>>const&,std::function<void(std::pair<std::__cxx11::string_const,wabt::Binding>const&,std::pair<std::__cxx11::string_const,wabt::Binding>const&)>)const::$_0>
              ::operator()((_Iter_pred<wabt::BindingHash::CallCallbacks(std::vector<std::pair<std::__cxx11::string_const,wabt::Binding>const*,std::allocator<std::pair<std::__cxx11::string_const,wabt::Binding>const*>>const&,std::function<void(std::pair<std::__cxx11::string_const,wabt::Binding>const&,std::pair<std::__cxx11::string_const,wabt::Binding>const&)>)const::__0>
                            *)&local_38,__it);
      _Var6._M_current = __it._M_current;
      if (!bVar3) {
        __it._M_current = __it._M_current + 1;
        goto LAB_00183cc5;
      }
    }
    else {
      _Var6._M_current = pppVar2;
      if ((lVar7 == 3) &&
         (bVar3 = __gnu_cxx::__ops::
                  _Iter_pred<wabt::BindingHash::CallCallbacks(std::vector<std::pair<std::__cxx11::string_const,wabt::Binding>const*,std::allocator<std::pair<std::__cxx11::string_const,wabt::Binding>const*>>const&,std::function<void(std::pair<std::__cxx11::string_const,wabt::Binding>const&,std::pair<std::__cxx11::string_const,wabt::Binding>const&)>)const::$_0>
                  ::operator()((_Iter_pred<wabt::BindingHash::CallCallbacks(std::vector<std::pair<std::__cxx11::string_const,wabt::Binding>const*,std::allocator<std::pair<std::__cxx11::string_const,wabt::Binding>const*>>const&,std::function<void(std::pair<std::__cxx11::string_const,wabt::Binding>const&,std::pair<std::__cxx11::string_const,wabt::Binding>const&)>)const::__0>
                                *)&local_38,__it), _Var6._M_current = __it._M_current, !bVar3)) {
        __it._M_current = __it._M_current + 1;
        goto LAB_00183ca7;
      }
    }
LAB_00183cda:
    if (_Var6._M_current != pppVar5) {
      if (_Var6._M_current ==
          (duplicates->
          super__Vector_base<const_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>_*,_std::allocator<const_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>_*>_>
          )._M_impl.super__Vector_impl_data._M_finish) {
        __assert_fail("first != duplicates.end()",
                      "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/binding-hash.cc"
                      ,0x56,
                      "void wabt::BindingHash::CallCallbacks(const ValueTypeVector &, DuplicateCallback) const"
                     );
      }
      std::
      function<void_(const_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>_&,_const_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>_&)>
      ::operator()(callback,*_Var6._M_current,*pppVar5);
    }
    pppVar5 = pppVar5 + 1;
  } while( true );
}

Assistant:

void BindingHash::CallCallbacks(const ValueTypeVector& duplicates,
                                DuplicateCallback callback) const {
  // Loop through all duplicates in order, and call callback with first
  // occurrence.
  for (auto iter = duplicates.begin(), end = duplicates.end(); iter != end;
       ++iter) {
    auto first = std::find_if(duplicates.begin(), duplicates.end(),
                              [iter](const value_type* x) -> bool {
                                return x->first == (*iter)->first;
                              });
    if (first == iter) {
      continue;
    }
    assert(first != duplicates.end());
    callback(**first, **iter);
  }
}